

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_pragma_function_info.cpp
# Opt level: O1

void __thiscall
duckdb::CreatePragmaFunctionInfo::CreatePragmaFunctionInfo
          (CreatePragmaFunctionInfo *this,string *name,PragmaFunctionSet *functions_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pPVar5;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"main","");
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,PRAGMA_FUNCTION_ENTRY,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreatePragmaFunctionInfo_0249a3b0;
  paVar2 = &(this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p =
       (pointer)paVar2;
  pcVar3 = (functions_p->super_FunctionSet<duckdb::PragmaFunction>).name._M_dataplus._M_p;
  paVar1 = &(functions_p->super_FunctionSet<duckdb::PragmaFunction>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)
             ((long)&(functions_p->super_FunctionSet<duckdb::PragmaFunction>).name.field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2 + 8) = uVar4;
  }
  else {
    (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = pcVar3;
    (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length =
       (functions_p->super_FunctionSet<duckdb::PragmaFunction>).name._M_string_length;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).name._M_dataplus._M_p = (pointer)paVar1;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).name._M_string_length = 0;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).name.field_2._M_local_buf[0] = '\0';
  pPVar5 = (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 8) = pPVar5;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 0x10) =
       (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (functions_p->super_FunctionSet<duckdb::PragmaFunction>).functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__cxx11::string::operator=((string *)&(this->super_CreateFunctionInfo).name,(string *)name)
  ;
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreatePragmaFunctionInfo::CreatePragmaFunctionInfo(string name, PragmaFunctionSet functions_p)
    : CreateFunctionInfo(CatalogType::PRAGMA_FUNCTION_ENTRY), functions(std::move(functions_p)) {
	this->name = std::move(name);
	internal = true;
}